

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

bool __thiscall
GF2::MI<45ul,GF2::MOGrlex<45ul>>::Find<45ul,GF2::MOLex<45ul>>
          (MI<45UL,_GF2::MOGrlex<45UL>_> *this,MP<45UL,_GF2::MOLex<45UL>_> *polyRight,iterator *pos)

{
  bool bVar1;
  _List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> _Var2;
  _Self *in_RDX;
  _List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> in_RDI;
  MP<45UL,_GF2::MOGrlex<45UL>_> poly;
  MOGrlex<45UL> *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  MP<45UL,_GF2::MOLex<45UL>_> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  byte bVar3;
  MP<45UL,_GF2::MOGrlex<45UL>_> *in_stack_ffffffffffffff78;
  _Self local_68 [3];
  _List_node_base *local_50;
  _List_node_base *local_48;
  _List_node_base *local_40;
  _List_node_base local_38 [2];
  _Self *local_18;
  
  _Var2._M_node = local_38;
  local_18 = in_RDX;
  MP<45UL,_GF2::MOGrlex<45UL>_>::MP
            ((MP<45UL,_GF2::MOGrlex<45UL>_> *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
             in_stack_ffffffffffffff58);
  local_48 = (_List_node_base *)
             std::__cxx11::
             list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
             ::begin((list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                      *)in_stack_ffffffffffffff58);
  local_50 = (_List_node_base *)
             std::__cxx11::
             list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
             ::end((list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                    *)in_stack_ffffffffffffff58);
  MP<45ul,GF2::MOGrlex<45ul>>::operator=
            ((MP<45UL,_GF2::MOGrlex<45UL>_> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  _Var2 = std::
          lower_bound<std::_List_iterator<GF2::MP<45ul,GF2::MOGrlex<45ul>>>,GF2::MP<45ul,GF2::MOGrlex<45ul>>>
                    (_Var2,in_RDI,in_stack_ffffffffffffff78);
  local_18->_M_node = _Var2._M_node;
  local_40 = _Var2._M_node;
  local_68[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
       ::end((list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
              *)in_stack_ffffffffffffff58);
  bVar1 = std::operator!=(local_18,local_68);
  bVar3 = false;
  if (bVar1) {
    std::_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::operator*
              ((_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *)0x1d6ba2);
    bVar3 = MP<45UL,_GF2::MOGrlex<45UL>_>::operator==
                      ((MP<45UL,_GF2::MOGrlex<45UL>_> *)_Var2._M_node,
                       (MP<45UL,_GF2::MOGrlex<45UL>_> *)CONCAT17(bVar3,in_stack_ffffffffffffff70));
  }
  MP<45UL,_GF2::MOGrlex<45UL>_>::~MP((MP<45UL,_GF2::MOGrlex<45UL>_> *)0x1d6bd1);
  return (bool)(bVar3 & 1);
}

Assistant:

bool Find(const MP<_m, _O1>& polyRight, iterator& pos)
	{
		MP<_n, _O> poly(_order);
		pos = std::lower_bound(begin(), end(), poly = polyRight);
		return pos != end() && *pos == poly;
	}